

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O1

void __thiscall
embree::SceneGraph::AnimatedPerspectiveCameraNode::AnimatedPerspectiveCameraNode
          (AnimatedPerspectiveCameraNode *this,
          vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
          *cameras,BBox1f time_range,string *id)

{
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  Node::Node((Node *)this,&local_40);
  (this->super_PerspectiveCameraNode).super_Node.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__Node_002cc3a8;
  *(undefined8 *)&(this->super_PerspectiveCameraNode).data.from.field_0 = 0x3f800000;
  *(undefined8 *)((long)&(this->super_PerspectiveCameraNode).data.from.field_0 + 8) = 0;
  *(undefined8 *)&(this->super_PerspectiveCameraNode).data.to.field_0 = 0;
  *(undefined8 *)((long)&(this->super_PerspectiveCameraNode).data.to.field_0 + 8) = 0;
  *(undefined8 *)&(this->super_PerspectiveCameraNode).data.up.field_0 = 0x3f80000000000000;
  *(undefined8 *)((long)&(this->super_PerspectiveCameraNode).data.up.field_0 + 8) = 0;
  (this->super_PerspectiveCameraNode).data.fov = 30.0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (this->super_PerspectiveCameraNode).super_Node.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__AnimatedPerspectiveCameraNode_002cc458;
  this->time_range = time_range;
  std::
  vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
  ::vector(&this->cameras,cameras);
  return;
}

Assistant:

AnimatedPerspectiveCameraNode (std::vector<Ref<PerspectiveCameraNode>>&& cameras, BBox1f time_range, const std::string& id = "")
        : time_range(time_range), cameras(cameras) {}